

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

bool HasAddressTaken(VariableData *container)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  VmConstant *pVVar4;
  VmValue *pVVar5;
  uint uVar6;
  VmValue **ppVVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (container->isVmRegSpill == false) {
    uVar2 = (container->users).count;
    for (uVar9 = 0; bVar10 = uVar9 != uVar2, bVar10; uVar9 = uVar9 + 1) {
      pVVar4 = (container->users).data[uVar9];
      bVar1 = (pVVar4->super_VmValue).hasKnownNonSimpleUse;
      if ((pVVar4->super_VmValue).hasKnownSimpleUse == true) {
        if (bVar1 != false) {
          __assert_fail("!user->hasKnownNonSimpleUse",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                        ,0x128,"bool HasAddressTaken(VariableData *)");
        }
      }
      else {
        if (bVar1 != false) {
          return bVar10;
        }
        uVar3 = (pVVar4->super_VmValue).users.count;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          pVVar5 = (pVVar4->super_VmValue).users.data[uVar8];
          if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 2)) {
            __assert_fail("!\"invalid constant use\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                          ,0x160,"bool HasAddressTaken(VariableData *)");
          }
          uVar6 = *(uint *)&pVVar5[1]._vptr_VmValue;
          if (6 < uVar6) {
            if (uVar6 - 8 < 7) {
              ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&pVVar5[1].typeID,0);
              if ((VmConstant *)*ppVVar7 == pVVar4) goto LAB_0025f0c2;
              uVar6 = *(uint *)&pVVar5[1]._vptr_VmValue;
            }
            if (uVar6 == 0x1b) {
              ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&pVVar5[1].typeID,0);
              if (((VmConstant *)*ppVVar7 == pVVar4) ||
                 (ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                      ((SmallArray<VmValue_*,_4U> *)&pVVar5[1].typeID,2),
                 (VmConstant *)*ppVVar7 == pVVar4)) goto LAB_0025f0c2;
              uVar6 = *(uint *)&pVVar5[1]._vptr_VmValue;
            }
            if (uVar6 == 0x1a) {
              ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                  ((SmallArray<VmValue_*,_4U> *)&pVVar5[1].typeID,0);
              if ((VmConstant *)*ppVVar7 == pVVar4) goto LAB_0025f0c2;
              uVar6 = *(uint *)&pVVar5[1]._vptr_VmValue;
            }
            if (uVar6 - 0x1f < 2) {
              if (pVVar4->isReference == false) {
LAB_0025f18c:
                (pVVar4->super_VmValue).hasKnownNonSimpleUse = true;
                return true;
              }
            }
            else if ((0x10 < uVar6 - 0x33) ||
                    (ppVVar7 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)&pVVar5[1].typeID,1),
                    (VmConstant *)*ppVVar7 != pVVar4)) goto LAB_0025f18c;
          }
LAB_0025f0c2:
        }
        (pVVar4->super_VmValue).hasKnownSimpleUse = true;
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool HasAddressTaken(VariableData *container)
{
	if(container->isVmRegSpill)
		return false;

	for(unsigned userPos = 0, userCount = container->users.count; userPos < userCount; userPos++)
	{
		VmConstant *user = container->users.data[userPos];

		if(user->hasKnownSimpleUse)
		{
			assert(!user->hasKnownNonSimpleUse);
			continue;
		}

		if(user->hasKnownNonSimpleUse)
			return true;

		for(unsigned i = 0, e = user->users.count; i < e; i++)
		{
			VmValue *value = user->users.data[i];

			if(VmInstruction *inst = value->typeID == VmInstruction::myTypeID ? static_cast<VmInstruction*>(value) : NULL)
			{
				bool simpleUse = false;

				if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
				{
					simpleUse = true;
				}
				else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
				{
					if(user->isReference)
						simpleUse = true;
					else
						simpleUse = false;
				}
				else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
				{
					simpleUse = true;
				}
				else
				{
					simpleUse = false;
				}

				if(!simpleUse)
				{
					user->hasKnownNonSimpleUse = true;

					return true;
				}
			}
			else
			{
				assert(!"invalid constant use");
			}
		}

		user->hasKnownSimpleUse = true;
	}

	return false;
}